

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O1

Expression * __thiscall
wasm::PossibleConstantValues::makeExpression(PossibleConstantValues *this,Module *wasm)

{
  uintptr_t uVar1;
  Expression *pEVar2;
  Global *pGVar3;
  Expression name;
  Literal local_48;
  Builder local_30;
  Builder builder;
  
  local_30.wasm = wasm;
  if (*(__index_type *)
       ((long)&(this->value).
               super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               .
               super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               .
               super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               .
               super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               .
               super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               .
               super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
       + 0x18) == '\x01') {
    getConstantLiteral(&local_48,this);
    pEVar2 = Builder::makeConstantExpression(&local_30,&local_48);
    Literal::~Literal(&local_48);
  }
  else {
    name = (Expression)getConstantGlobal(this);
    pGVar3 = Module::getGlobal(wasm,(Name)name);
    uVar1 = (pGVar3->type).id;
    pEVar2 = (Expression *)MixedArena::allocSpace(&(local_30.wasm)->allocator,0x20,8);
    pEVar2->_id = GlobalGetId;
    (pEVar2->type).id = 0;
    *(undefined8 *)(pEVar2 + 1) = 0;
    pEVar2[1] = name;
    (pEVar2->type).id = uVar1;
  }
  return pEVar2;
}

Assistant:

Expression* makeExpression(Module& wasm) {
    Builder builder(wasm);
    if (isConstantLiteral()) {
      return builder.makeConstantExpression(getConstantLiteral());
    } else {
      auto name = getConstantGlobal();
      return builder.makeGlobalGet(name, wasm.getGlobal(name)->type);
    }
  }